

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O3

Gia_Man_t * Au_NtkDeriveFlatGia(Au_Ntk_t *p)

{
  char *__s;
  Gia_Obj_t *pGVar1;
  long lVar2;
  Gia_Man_t *p_00;
  size_t sVar3;
  char *__dest;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  Gia_Man_t *pGVar6;
  uint uVar7;
  long *plVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  
  __dest = (char *)0x0;
  printf("Collapsing model \"%s\"...\n",p->pName);
  Au_NtkCleanCopy(p);
  p_00 = Gia_ManStart(0x10000);
  __s = p->pName;
  if (__s != (char *)0x0) {
    sVar3 = strlen(__s);
    __dest = (char *)malloc(sVar3 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  Gia_ManHashAlloc(p_00);
  *(byte *)&p_00->fVerbose = (byte)p_00->fVerbose ^ 1;
  uVar7 = (p->vPis).nSize;
  uVar5 = (ulong)uVar7;
  if (0 < (int)uVar7) {
    lVar12 = 0;
    do {
      if ((int)uVar5 <= lVar12) goto LAB_0085d56a;
      uVar7 = (p->vPis).pArray[lVar12];
      uVar9 = (ulong)((uVar7 & 0xfff) << 4) + (long)(p->vPages).pArray[(int)uVar7 >> 0xc];
      pGVar4 = Gia_ManAppendObj(p_00);
      uVar5 = *(ulong *)pGVar4;
      *(ulong *)pGVar4 = uVar5 | 0x9fffffff;
      *(ulong *)pGVar4 =
           uVar5 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar1 = p_00->pObjs;
      if ((pGVar4 < pGVar1) || (pGVar1 + p_00->nObjs <= pGVar4)) goto LAB_0085d54b;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar4 - (long)pGVar1) >> 2) * -0x55555555);
      pGVar1 = p_00->pObjs;
      if ((pGVar4 < pGVar1) || (pGVar1 + p_00->nObjs <= pGVar4)) goto LAB_0085d54b;
      plVar8 = (long *)(uVar9 & 0xfffffffffffffc00);
      uVar7 = *(uint *)(plVar8 + 1);
      if ((int)uVar7 < 0) {
LAB_0085d589:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      lVar2 = *plVar8;
      uVar7 = uVar7 | (uint)(uVar9 >> 4) & 0x3f;
      if (*(int *)(lVar2 + 0xa4) <= (int)uVar7) goto LAB_0085d589;
      *(int *)(*(long *)(lVar2 + 0xa8) + (ulong)uVar7 * 4) =
           (int)((ulong)((long)pGVar4 - (long)pGVar1) >> 2) * 0x55555556;
      lVar12 = lVar12 + 1;
      uVar5 = (ulong)(p->vPis).nSize;
    } while (lVar12 < (long)uVar5);
  }
  Au_NtkDeriveFlatGia_rec(p_00,p);
  uVar7 = (p->vPos).nSize;
  uVar5 = (ulong)uVar7;
  if (0 < (int)uVar7) {
    lVar12 = 0;
    do {
      if ((int)uVar5 <= lVar12) {
LAB_0085d56a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar7 = (p->vPos).pArray[lVar12];
      uVar5 = (ulong)((uVar7 & 0xfff) << 4) + (long)(p->vPages).pArray[(int)uVar7 >> 0xc];
      plVar8 = (long *)(uVar5 & 0xfffffffffffffc00);
      uVar7 = *(uint *)(plVar8 + 1);
      if ((int)uVar7 < 0) goto LAB_0085d56a;
      lVar2 = *plVar8;
      uVar7 = (uint)(uVar5 >> 4) & 0x3f | uVar7;
      if (*(int *)(lVar2 + 0xa4) <= (int)uVar7) goto LAB_0085d56a;
      uVar7 = *(uint *)(*(long *)(lVar2 + 0xa8) + (ulong)uVar7 * 4);
      if ((int)uVar7 < 0) {
LAB_0085d5a8:
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      uVar11 = uVar7 >> 1;
      if (p_00->nObjs <= (int)uVar11) goto LAB_0085d5a8;
      if ((~*(uint *)(p_00->pObjs + uVar11) & 0x1fffffff) != 0 &&
          (int)*(uint *)(p_00->pObjs + uVar11) < 0) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      pGVar4 = Gia_ManAppendObj(p_00);
      uVar5 = *(ulong *)pGVar4;
      *(ulong *)pGVar4 = uVar5 | 0x80000000;
      pGVar1 = p_00->pObjs;
      if ((pGVar4 < pGVar1) || (pGVar1 + p_00->nObjs <= pGVar4)) {
LAB_0085d54b:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar9 = (ulong)(((uint)((int)pGVar4 - (int)pGVar1) >> 2) * -0x55555555 - uVar11 & 0x1fffffff);
      uVar10 = (ulong)((uVar7 & 1) << 0x1d);
      *(ulong *)pGVar4 = uVar10 | uVar5 & 0xffffffffc0000000 | 0x80000000 | uVar9;
      *(ulong *)pGVar4 =
           uVar10 | uVar5 & 0xe0000000c0000000 | 0x80000000 | uVar9 |
           (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
      pGVar1 = p_00->pObjs;
      if ((pGVar4 < pGVar1) || (pGVar1 + p_00->nObjs <= pGVar4)) goto LAB_0085d54b;
      Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar4 - (long)pGVar1) >> 2) * -0x55555555);
      if (p_00->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p_00,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff),pGVar4);
      }
      if ((pGVar4 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar4)) goto LAB_0085d54b;
      lVar12 = lVar12 + 1;
      uVar5 = (ulong)(p->vPos).nSize;
    } while (lVar12 < (long)uVar5);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,0);
  pGVar6 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar6;
}

Assistant:

Gia_Man_t * Au_NtkDeriveFlatGia( Au_Ntk_t * p )
{
    Gia_Man_t * pTemp, * pGia = NULL;
    Au_Obj_t * pTerm;
    int i;
    printf( "Collapsing model \"%s\"...\n", Au_NtkName(p) );
    Au_NtkCleanCopy( p );
    // start the network
    pGia = Gia_ManStart( (1<<16) );
    pGia->pName = Abc_UtilStrsav( Au_NtkName(p) );
//    pGia->pSpec = Abc_UtilStrsav( Au_NtkSpec(p) );
    Gia_ManHashAlloc( pGia );
    Gia_ManFlipVerbose( pGia );
    // create PIs
    Au_NtkForEachPi( p, pTerm, i )
        Au_ObjSetCopy( pTerm, Gia_ManAppendCi(pGia) );
    // recursively flatten hierarchy
    Au_NtkDeriveFlatGia_rec( pGia, p );
    // create POs
    Au_NtkForEachPo( p, pTerm, i )
        Gia_ManAppendCo( pGia, Au_ObjCopy(pTerm) );
    // prepare return value
//    Gia_ManHashProfile( pGia );
    Gia_ManHashStop( pGia );
    Gia_ManSetRegNum( pGia, 0 );
    pGia = Gia_ManCleanup( pTemp = pGia );
    Gia_ManStop( pTemp );
    return pGia;
}